

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall
TeamChange2IRCCommand::trigger
          (TeamChange2IRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  size_t lhs;
  char *pcVar1;
  iterator iVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  long lVar6;
  ulong uVar7;
  size_type sVar8;
  pointer pPVar9;
  size_t sVar10;
  reference pPVar11;
  basic_string_view<char,_std::char_traits<char>_> bVar12;
  size_t local_f8;
  char *local_f0;
  size_t local_d8;
  char *local_d0;
  char *local_b8;
  char *local_b0;
  _Self local_88;
  _Self local_80;
  iterator node;
  Server *server;
  uint i;
  bool playerFound;
  string_view playerName;
  int type;
  Channel *chan;
  IRC_Bot *source_local;
  TeamChange2IRCCommand *this_local;
  string_view nick_local;
  string_view channel_local;
  
  bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&parameters);
  if (bVar3) {
    bVar12 = sv("Error: Too Few Parameters. Syntax: team2 <player>",0x31);
    local_f8 = bVar12._M_len;
    local_f0 = bVar12._M_str;
    Jupiter::IRC::Client::sendNotice(source,nick._M_len,nick._M_str,local_f8,local_f0);
  }
  else {
    lVar6 = Jupiter::IRC::Client::getChannel(source,channel._M_len,channel._M_str);
    if (lVar6 != 0) {
      Jupiter::IRC::Client::Channel::getType();
      lhs = parameters._M_len;
      pcVar1 = parameters._M_str;
      bVar3 = false;
      server._0_4_ = 0;
      while( true ) {
        RenX::getCore();
        local_b8 = (char *)RenX::Core::getServerCount();
        if ((char *)(ulong)(uint)server == local_b8) break;
        uVar7 = RenX::getCore();
        node._M_node = (_List_node_base *)RenX::Core::getServer(uVar7);
        uVar7 = RenX::Server::isLogChanType((int)node._M_node);
        if (((uVar7 & 1) != 0) &&
           (sVar8 = std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::size
                              ((list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_> *)
                               (node._M_node + 1)), sVar8 != 0)) {
          local_80._M_node =
               (_List_node_base *)
               std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::begin
                         (node._M_node + 1);
          while( true ) {
            local_88._M_node =
                 (_List_node_base *)
                 std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::end
                           (node._M_node + 1);
            bVar4 = std::operator==(&local_80,&local_88);
            if (((bVar4 ^ 0xffU) & 1) == 0) break;
            pPVar9 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_80);
            bVar12._M_str = local_b8;
            bVar12._M_len = (size_t)pcVar1;
            sVar10 = jessilib::findi<char,char>
                               ((jessilib *)&pPVar9->name,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )lhs,bVar12);
            iVar2 = node;
            if (sVar10 != 0xffffffffffffffff) {
              bVar3 = true;
              pPVar11 = std::_List_iterator<RenX::PlayerInfo>::operator*(&local_80);
              bVar5 = RenX::Server::changeTeam((PlayerInfo *)iVar2._M_node,SUB81(pPVar11,0));
              if ((bVar5 & 1) == 0) {
                bVar12 = sv("Error: Server does not support team changing.",0x2d);
                local_b8 = (char *)bVar12._M_len;
                local_b0 = bVar12._M_str;
                Jupiter::IRC::Client::sendMessage
                          (source,channel._M_len,channel._M_str,local_b8,local_b0);
              }
            }
            std::_List_iterator<RenX::PlayerInfo>::operator++(&local_80);
          }
        }
        server._0_4_ = (uint)server + 1;
      }
      if (!bVar3) {
        bVar12 = sv("Error: Player not found.",0x18);
        local_d8 = bVar12._M_len;
        local_d0 = bVar12._M_str;
        Jupiter::IRC::Client::sendNotice(source,nick._M_len,nick._M_str,local_d8,local_d0);
      }
    }
  }
  return;
}

Assistant:

void TeamChange2IRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	if (!parameters.empty()) {
		Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
		if (chan != nullptr) {
			int type = chan->getType();
			std::string_view playerName{ parameters };
			bool playerFound = false;
			for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++) {
				RenX::Server *server = RenX::getCore()->getServer(i);
				if (server->isLogChanType(type) && server->players.size() != 0) {
					for (auto node = server->players.begin(); node != server->players.end(); ++node) {
						if (jessilib::findi(node->name, playerName) != std::string::npos) {
							playerFound = true;
							if (server->changeTeam(*node, false) == false) {
								source->sendMessage(channel, "Error: Server does not support team changing."sv);
							}
						}
					}
				}
			}
			if (playerFound == false)
				source->sendNotice(nick, "Error: Player not found."sv);
		}
	}
	else source->sendNotice(nick, "Error: Too Few Parameters. Syntax: team2 <player>"sv);
}